

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.h
# Opt level: O0

bool __thiscall V1Transport::ReceivedBytes(V1Transport *this,Span<const_unsigned_char> *msg_bytes)

{
  long lVar1;
  V1Transport *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  byte bVar2;
  Span<const_unsigned_char> SVar3;
  V1Transport *in_stack_00000008;
  int ret;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock6;
  undefined1 in_stack_00000090 [16];
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  char *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  int local_80;
  char *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  _func_int **local_48;
  uchar *in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockNotHeldInline
            ((char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
             in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,(Mutex *)0x1020bac);
  MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_RSI,
             (AnnotatedMixin<std::mutex> *)
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98
             ,in_stack_ffffffffffffff90,(int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0))
  ;
  if ((*(byte *)(in_RDI + 200) & 1) == 0) {
    in_stack_ffffffffffffff7c =
         readHeader(in_stack_00000008,(Span<const_unsigned_char>)in_stack_00000090);
    local_80 = in_stack_ffffffffffffff7c;
  }
  else {
    SVar3.m_size = in_stack_ffffffffffffffc8;
    SVar3.m_data = in_stack_ffffffffffffffc0;
    local_80 = readData(in_RSI,SVar3);
  }
  if (local_80 < 0) {
    Reset((V1Transport *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  }
  else {
    SVar3 = Span<const_unsigned_char>::subspan
                      ((Span<const_unsigned_char> *)
                       CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                       (size_t)in_stack_ffffffffffffff70);
    local_48 = (_func_int **)SVar3.m_data;
    (in_RSI->super_Transport)._vptr_Transport = local_48;
    *(size_t *)&in_RSI->m_magic_bytes = SVar3.m_size;
  }
  bVar2 = -1 < local_80;
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar2 & 1);
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_recv_mutex)
    {
        AssertLockNotHeld(m_recv_mutex);
        LOCK(m_recv_mutex);
        int ret = in_data ? readData(msg_bytes) : readHeader(msg_bytes);
        if (ret < 0) {
            Reset();
        } else {
            msg_bytes = msg_bytes.subspan(ret);
        }
        return ret >= 0;
    }